

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::GenerateGlobalEffects::run(wasm::Module*)::
FuncInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::
Function*,wasm::GenerateGlobalEffects::run(wasm::Module*)::FuncInfo&)>)::Mapper::doWalkFunction(wasm
::Function__(void *this,Function *curr)

{
  Function *__args;
  size_type sVar1;
  mapped_type *__args_1;
  Function *local_20;
  Function *curr_local;
  
  local_20 = curr;
  sVar1 = std::
          map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
          ::count(*(map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
                    **)((long)this + 0x138),&local_20);
  __args = local_20;
  if (sVar1 != 0) {
    __args_1 = std::
               map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
               ::operator[](*(map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
                              **)((long)this + 0x138),&local_20);
    std::function<void_(wasm::Function_*,_FuncInfo_&)>::operator()
              ((function<void_(wasm::Function_*,_FuncInfo_&)> *)((long)this + 0x140),__args,__args_1
              );
    return;
  }
  __assert_fail("map.count(curr)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                ,0x13e,
                "void wasm::ModuleUtils::ParallelFunctionAnalysis<FuncInfo>::doAnalysis(Func)::Mapper::doWalkFunction(Function *) [T = FuncInfo, Mut = wasm::Immutable, MapT = wasm::ModuleUtils::DefaultMap]"
               );
}

Assistant:

void doWalkFunction(Function* curr) {
        assert(map.count(curr));
        work(curr, map[curr]);
      }